

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_CreateMultisigRedeemScriptTest_Test::TestBody
          (ScriptUtil_CreateMultisigRedeemScriptTest_Test *this)

{
  allocator<MultisigTestVector> *this_00;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::Pubkey> __l_01;
  initializer_list<cfd::core::Pubkey> __l_02;
  initializer_list<cfd::core::Pubkey> __l_03;
  initializer_list<cfd::core::Pubkey> __l_04;
  initializer_list<MultisigTestVector> __l_05;
  bool bVar1;
  reference pMVar2;
  char *pcVar3;
  char *rhs;
  Pubkey *local_19c0;
  Pubkey *local_19a8;
  Pubkey *local_1990;
  Pubkey *local_1978;
  Pubkey *local_1960;
  Pubkey *local_1948;
  MultisigTestVector *local_1930;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *except;
  Message local_1430;
  string local_1428 [32];
  string local_1408 [32];
  undefined1 local_13e8 [8];
  AssertionResult gtest_ar;
  undefined1 local_13a0 [8];
  MultisigTestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *__range1;
  Script actual;
  string local_12c8 [37];
  allocator<cfd::core::Pubkey> local_12a3;
  undefined1 local_12a2;
  allocator local_12a1;
  string local_12a0 [39];
  allocator local_1279;
  string local_1278 [39];
  allocator local_1251;
  string local_1250 [39];
  allocator local_1229;
  string local_1228 [39];
  allocator local_1201;
  string local_1200 [39];
  allocator local_11d9;
  string local_11d8 [39];
  allocator local_11b1;
  string local_11b0 [39];
  allocator local_1189;
  string local_1188 [39];
  allocator local_1161;
  string local_1160 [39];
  allocator local_1139;
  string local_1138 [39];
  allocator local_1111;
  string local_1110 [39];
  allocator local_10e9;
  string local_10e8 [39];
  allocator local_10c1;
  string local_10c0 [39];
  allocator local_1099;
  string local_1098 [39];
  allocator local_1071;
  string local_1070 [39];
  allocator local_1049;
  string local_1048 [39];
  allocator local_1021;
  string local_1020 [39];
  allocator local_ff9;
  string local_ff8 [39];
  allocator local_fd1;
  string local_fd0 [39];
  allocator local_fa9;
  string local_fa8 [32];
  Pubkey *local_f88;
  Pubkey local_f80;
  Pubkey local_f68;
  Pubkey local_f50;
  Pubkey local_f38;
  Pubkey local_f20;
  Pubkey local_f08;
  Pubkey local_ef0;
  Pubkey local_ed8;
  Pubkey local_ec0;
  Pubkey local_ea8;
  Pubkey local_e90;
  Pubkey local_e78;
  Pubkey local_e60;
  Pubkey local_e48;
  Pubkey local_e30;
  Pubkey local_e18;
  Pubkey local_e00;
  Pubkey local_de8;
  Pubkey local_dd0;
  Pubkey local_db8;
  undefined1 local_da0 [23];
  allocator local_d89;
  string local_d88 [37];
  allocator<cfd::core::Pubkey> local_d63;
  undefined1 local_d62;
  allocator local_d61;
  string local_d60 [39];
  allocator local_d39;
  string local_d38 [39];
  allocator local_d11;
  string local_d10 [39];
  allocator local_ce9;
  string local_ce8 [39];
  allocator local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [39];
  allocator local_c71;
  string local_c70 [39];
  allocator local_c49;
  string local_c48 [39];
  allocator local_c21;
  string local_c20 [39];
  allocator local_bf9;
  string local_bf8 [39];
  allocator local_bd1;
  string local_bd0 [39];
  allocator local_ba9;
  string local_ba8 [39];
  allocator local_b81;
  string local_b80 [39];
  allocator local_b59;
  string local_b58 [39];
  allocator local_b31;
  string local_b30 [32];
  Pubkey *local_b10;
  Pubkey local_b08;
  Pubkey local_af0;
  Pubkey local_ad8;
  Pubkey local_ac0;
  Pubkey local_aa8;
  Pubkey local_a90;
  Pubkey local_a78;
  Pubkey local_a60;
  Pubkey local_a48;
  Pubkey local_a30;
  Pubkey local_a18;
  Pubkey local_a00;
  Pubkey local_9e8;
  Pubkey local_9d0;
  Pubkey local_9b8;
  undefined1 local_9a0 [23];
  allocator local_989;
  string local_988 [37];
  allocator<cfd::core::Pubkey> local_963;
  undefined1 local_962;
  allocator local_961;
  string local_960 [39];
  allocator local_939;
  string local_938 [39];
  allocator local_911;
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [39];
  allocator local_899;
  string local_898 [39];
  allocator local_871;
  string local_870 [39];
  allocator local_849;
  string local_848 [39];
  allocator local_821;
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [39];
  allocator local_7a9;
  string local_7a8 [39];
  allocator local_781;
  string local_780 [39];
  allocator local_759;
  string local_758 [39];
  allocator local_731;
  string local_730 [32];
  Pubkey *local_710;
  Pubkey local_708;
  Pubkey local_6f0;
  Pubkey local_6d8;
  Pubkey local_6c0;
  Pubkey local_6a8;
  Pubkey local_690;
  Pubkey local_678;
  Pubkey local_660;
  Pubkey local_648;
  Pubkey local_630;
  Pubkey local_618;
  Pubkey local_600;
  Pubkey local_5e8;
  Pubkey local_5d0;
  Pubkey local_5b8;
  undefined1 local_5a0 [23];
  allocator local_589;
  string local_588 [37];
  allocator<cfd::core::Pubkey> local_563;
  undefined1 local_562;
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [32];
  Pubkey *local_4f0;
  Pubkey local_4e8;
  Pubkey local_4d0;
  Pubkey local_4b8;
  undefined1 local_4a0 [23];
  allocator local_489;
  string local_488 [37];
  allocator<cfd::core::Pubkey> local_463;
  undefined1 local_462;
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  Pubkey *local_418;
  Pubkey local_410;
  Pubkey local_3f8;
  undefined1 local_3e0 [23];
  allocator local_3c9;
  string local_3c8 [34];
  allocator<cfd::core::Pubkey> local_3a6;
  undefined1 local_3a5;
  allocator local_391;
  string local_390 [32];
  Pubkey *local_370;
  Pubkey local_368;
  Pubkey local_350;
  MultisigTestVector local_338;
  uchar local_2b8 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_2b0;
  Script SStack_298;
  string asStack_260 [32];
  undefined1 local_240;
  uchar local_238 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_230;
  Script SStack_218;
  string asStack_1e0 [32];
  undefined1 local_1c0;
  uchar local_1b8 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_1b0;
  Script SStack_198;
  string asStack_160 [32];
  undefined1 local_140;
  uchar local_138 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_130;
  Script SStack_118;
  string asStack_e0 [32];
  undefined1 local_c0;
  uchar local_b8 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_b0;
  Script SStack_98;
  string asStack_60 [32];
  undefined1 local_40;
  iterator local_38;
  pointer local_30;
  undefined1 local_28 [8];
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> test_vectors;
  ScriptUtil_CreateMultisigRedeemScriptTest_Test *this_local;
  
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_338;
  local_338.req_sig = 1;
  local_3a5 = 1;
  local_370 = &local_368;
  test_vectors.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_390,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_391);
  cfd::core::Pubkey::Pubkey(&local_368,local_390);
  local_3a5 = 0;
  local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_368;
  local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  std::allocator<cfd::core::Pubkey>::allocator(&local_3a6);
  __l_04._M_len =
       (size_type)
       local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __l_04._M_array =
       (iterator)
       local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_338.input_pubkeys,__l_04,&local_3a6);
  local_3e0[0x14] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3c8,"512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a051ae",
             &local_3c9);
  cfd::core::Script::Script(&local_338.expect_multisig_script,local_3c8);
  local_3e0[0x15] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_338.expect_message,"",(allocator *)(local_3e0 + 0x16));
  local_338.is_witness = false;
  local_3e0[0x15] = 0;
  local_3e0[0x14] = 0;
  local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_2b8;
  local_2b8[0] = '\x01';
  local_2b8[1] = '\0';
  local_2b8[2] = '\0';
  local_2b8[3] = '\0';
  local_462 = 1;
  local_418 = &local_410;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_438,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_439);
  cfd::core::Pubkey::Pubkey(&local_410,local_438);
  local_418 = &local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_460,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_461);
  cfd::core::Pubkey::Pubkey(&local_3f8,local_460);
  local_462 = 0;
  local_3e0._0_8_ = &local_410;
  local_3e0._8_8_ = (pointer)0x2;
  std::allocator<cfd::core::Pubkey>::allocator(&local_463);
  __l_03._M_len = local_3e0._8_8_;
  __l_03._M_array = (iterator)local_3e0._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_2b0,__l_03,&local_463);
  local_4a0[0x14] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_488,
             "512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c52ae"
             ,&local_489);
  cfd::core::Script::Script(&SStack_298,local_488);
  local_4a0[0x15] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_260,"",(allocator *)(local_4a0 + 0x16));
  local_240 = 0;
  local_4a0[0x15] = 0;
  local_4a0[0x14] = 0;
  local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_238;
  local_238[0] = '\x02';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_562 = 1;
  local_4f0 = &local_4e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_510,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_511);
  cfd::core::Pubkey::Pubkey(&local_4e8,local_510);
  local_4f0 = &local_4d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_538,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_539);
  cfd::core::Pubkey::Pubkey(&local_4d0,local_538);
  local_4f0 = &local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_560,"024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",
             &local_561);
  cfd::core::Pubkey::Pubkey(&local_4b8,local_560);
  local_562 = 0;
  local_4a0._0_8_ = &local_4e8;
  local_4a0._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::Pubkey>::allocator(&local_563);
  __l_02._M_len = local_4a0._8_8_;
  __l_02._M_array = (iterator)local_4a0._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_230,__l_02,&local_563);
  local_5a0[0x14] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_588,
             "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
             ,&local_589);
  cfd::core::Script::Script(&SStack_218,local_588);
  local_5a0[0x15] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1e0,"",(allocator *)(local_5a0 + 0x16));
  local_1c0 = 0;
  local_5a0[0x15] = 0;
  local_5a0[0x14] = 0;
  local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_1b8;
  local_1b8[0] = '\f';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_962 = 1;
  local_710 = &local_708;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_730,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_731);
  cfd::core::Pubkey::Pubkey(&local_708,local_730);
  local_710 = &local_6f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_758,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_759);
  cfd::core::Pubkey::Pubkey(&local_6f0,local_758);
  local_710 = &local_6d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_780,"024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",
             &local_781);
  cfd::core::Pubkey::Pubkey(&local_6d8,local_780);
  local_710 = &local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7a8,"03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",
             &local_7a9);
  cfd::core::Pubkey::Pubkey(&local_6c0,local_7a8);
  local_710 = &local_6a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7d0,"020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",
             &local_7d1);
  cfd::core::Pubkey::Pubkey(&local_6a8,local_7d0);
  local_710 = &local_690;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7f8,"0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",
             &local_7f9);
  cfd::core::Pubkey::Pubkey(&local_690,local_7f8);
  local_710 = &local_678;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_820,"0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",
             &local_821);
  cfd::core::Pubkey::Pubkey(&local_678,local_820);
  local_710 = &local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_848,"020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",
             &local_849);
  cfd::core::Pubkey::Pubkey(&local_660,local_848);
  local_710 = &local_648;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_870,"0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",
             &local_871);
  cfd::core::Pubkey::Pubkey(&local_648,local_870);
  local_710 = &local_630;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_898,"0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",
             &local_899);
  cfd::core::Pubkey::Pubkey(&local_630,local_898);
  local_710 = &local_618;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8c0,"03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",
             &local_8c1);
  cfd::core::Pubkey::Pubkey(&local_618,local_8c0);
  local_710 = &local_600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8e8,"02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",
             &local_8e9);
  cfd::core::Pubkey::Pubkey(&local_600,local_8e8);
  local_710 = &local_5e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_910,"0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",
             &local_911);
  cfd::core::Pubkey::Pubkey(&local_5e8,local_910);
  local_710 = &local_5d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_938,"0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",
             &local_939);
  cfd::core::Pubkey::Pubkey(&local_5d0,local_938);
  local_710 = &local_5b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_960,"025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",
             &local_961);
  cfd::core::Pubkey::Pubkey(&local_5b8,local_960);
  local_962 = 0;
  local_5a0._0_8_ = &local_708;
  local_5a0._8_8_ = (pointer)0xf;
  std::allocator<cfd::core::Pubkey>::allocator(&local_963);
  __l_01._M_len = local_5a0._8_8_;
  __l_01._M_array = (iterator)local_5a0._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_1b0,__l_01,&local_963);
  local_9a0[0x14] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_988,
             "5c2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"
             ,&local_989);
  cfd::core::Script::Script(&SStack_198,local_988);
  local_9a0[0x15] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_160,"",(allocator *)(local_9a0 + 0x16));
  local_140 = 0;
  local_9a0[0x15] = 0;
  local_9a0[0x14] = 0;
  local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_138;
  local_138[0] = '\x0f';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_d62 = 1;
  local_b10 = &local_b08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b30,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_b31);
  cfd::core::Pubkey::Pubkey(&local_b08,local_b30);
  local_b10 = &local_af0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b58,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_b59);
  cfd::core::Pubkey::Pubkey(&local_af0,local_b58);
  local_b10 = &local_ad8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b80,"024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",
             &local_b81);
  cfd::core::Pubkey::Pubkey(&local_ad8,local_b80);
  local_b10 = &local_ac0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ba8,"03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",
             &local_ba9);
  cfd::core::Pubkey::Pubkey(&local_ac0,local_ba8);
  local_b10 = &local_aa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_bd0,"020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",
             &local_bd1);
  cfd::core::Pubkey::Pubkey(&local_aa8,local_bd0);
  local_b10 = &local_a90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_bf8,"0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",
             &local_bf9);
  cfd::core::Pubkey::Pubkey(&local_a90,local_bf8);
  local_b10 = &local_a78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c20,"0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",
             &local_c21);
  cfd::core::Pubkey::Pubkey(&local_a78,local_c20);
  local_b10 = &local_a60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c48,"020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",
             &local_c49);
  cfd::core::Pubkey::Pubkey(&local_a60,local_c48);
  local_b10 = &local_a48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c70,"0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",
             &local_c71);
  cfd::core::Pubkey::Pubkey(&local_a48,local_c70);
  local_b10 = &local_a30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c98,"0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",
             &local_c99);
  cfd::core::Pubkey::Pubkey(&local_a30,local_c98);
  local_b10 = &local_a18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_cc0,"03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",
             &local_cc1);
  cfd::core::Pubkey::Pubkey(&local_a18,local_cc0);
  local_b10 = &local_a00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ce8,"02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",
             &local_ce9);
  cfd::core::Pubkey::Pubkey(&local_a00,local_ce8);
  local_b10 = &local_9e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d10,"0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",
             &local_d11);
  cfd::core::Pubkey::Pubkey(&local_9e8,local_d10);
  local_b10 = &local_9d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d38,"0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",
             &local_d39);
  cfd::core::Pubkey::Pubkey(&local_9d0,local_d38);
  local_b10 = &local_9b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d60,"025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",
             &local_d61);
  cfd::core::Pubkey::Pubkey(&local_9b8,local_d60);
  local_d62 = 0;
  local_9a0._0_8_ = &local_b08;
  local_9a0._8_8_ = (pointer)0xf;
  std::allocator<cfd::core::Pubkey>::allocator(&local_d63);
  __l_00._M_len = local_9a0._8_8_;
  __l_00._M_array = (iterator)local_9a0._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_130,__l_00,&local_d63);
  local_da0[0x14] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d88,
             "5f2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"
             ,&local_d89);
  cfd::core::Script::Script(&SStack_118,local_d88);
  local_da0[0x15] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_e0,"",(allocator *)(local_da0 + 0x16));
  local_c0 = 0;
  local_da0[0x15] = 0;
  local_da0[0x14] = 0;
  local_350.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_b8;
  local_b8[0] = '\x14';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_12a2 = 1;
  local_f88 = &local_f80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fa8,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_fa9);
  cfd::core::Pubkey::Pubkey(&local_f80,local_fa8);
  local_f88 = &local_f68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fd0,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_fd1);
  cfd::core::Pubkey::Pubkey(&local_f68,local_fd0);
  local_f88 = &local_f50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ff8,"024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",
             &local_ff9);
  cfd::core::Pubkey::Pubkey(&local_f50,local_ff8);
  local_f88 = &local_f38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1020,"03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",
             &local_1021);
  cfd::core::Pubkey::Pubkey(&local_f38,local_1020);
  local_f88 = &local_f20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1048,"020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",
             &local_1049);
  cfd::core::Pubkey::Pubkey(&local_f20,local_1048);
  local_f88 = &local_f08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1070,"0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",
             &local_1071);
  cfd::core::Pubkey::Pubkey(&local_f08,local_1070);
  local_f88 = &local_ef0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1098,"0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",
             &local_1099);
  cfd::core::Pubkey::Pubkey(&local_ef0,local_1098);
  local_f88 = &local_ed8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_10c0,"020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",
             &local_10c1);
  cfd::core::Pubkey::Pubkey(&local_ed8,local_10c0);
  local_f88 = &local_ec0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_10e8,"0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",
             &local_10e9);
  cfd::core::Pubkey::Pubkey(&local_ec0,local_10e8);
  local_f88 = &local_ea8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1110,"0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",
             &local_1111);
  cfd::core::Pubkey::Pubkey(&local_ea8,local_1110);
  local_f88 = &local_e90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1138,"03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",
             &local_1139);
  cfd::core::Pubkey::Pubkey(&local_e90,local_1138);
  local_f88 = &local_e78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1160,"02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",
             &local_1161);
  cfd::core::Pubkey::Pubkey(&local_e78,local_1160);
  local_f88 = &local_e60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1188,"0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",
             &local_1189);
  cfd::core::Pubkey::Pubkey(&local_e60,local_1188);
  local_f88 = &local_e48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_11b0,"0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",
             &local_11b1);
  cfd::core::Pubkey::Pubkey(&local_e48,local_11b0);
  local_f88 = &local_e30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_11d8,"025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",
             &local_11d9);
  cfd::core::Pubkey::Pubkey(&local_e30,local_11d8);
  local_f88 = &local_e18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1200,"030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55",
             &local_1201);
  cfd::core::Pubkey::Pubkey(&local_e18,local_1200);
  local_f88 = &local_e00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1228,"0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e",
             &local_1229);
  cfd::core::Pubkey::Pubkey(&local_e00,local_1228);
  local_f88 = &local_de8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1250,"02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8",
             &local_1251);
  cfd::core::Pubkey::Pubkey(&local_de8,local_1250);
  local_f88 = &local_dd0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1278,"03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950",
             &local_1279);
  cfd::core::Pubkey::Pubkey(&local_dd0,local_1278);
  local_f88 = &local_db8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_12a0,"024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561",
             &local_12a1);
  cfd::core::Pubkey::Pubkey(&local_db8,local_12a0);
  local_12a2 = 0;
  local_da0._0_8_ = &local_f80;
  local_da0._8_8_ = (pointer)0x14;
  std::allocator<cfd::core::Pubkey>::allocator(&local_12a3);
  __l._M_len = local_da0._8_8_;
  __l._M_array = (iterator)local_da0._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_b0,__l,&local_12a3);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_12c8,
             "01142102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db21030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55210267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e2102f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b82103968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb595021024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd25610114ae"
             ,(allocator *)
              ((long)&actual.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script(&SStack_98,local_12c8);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_60,"",
             (allocator *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  local_40 = 1;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  local_38 = &local_338;
  local_30 = (pointer)0x6;
  this_00 = (allocator<MultisigTestVector> *)
            ((long)&actual.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  std::allocator<MultisigTestVector>::allocator(this_00);
  __l_05._M_len = (size_type)local_30;
  __l_05._M_array = local_38;
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::vector
            ((vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *)local_28,__l_05,
             this_00);
  std::allocator<MultisigTestVector>::~allocator
            ((allocator<MultisigTestVector> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  local_1930 = (MultisigTestVector *)&local_38;
  do {
    local_1930 = local_1930 + -1;
    MultisigTestVector::~MultisigTestVector(local_1930);
  } while (local_1930 != &local_338);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::__cxx11::string::~string(local_12c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<cfd::core::Pubkey>::~allocator(&local_12a3);
  local_1948 = (Pubkey *)local_da0;
  do {
    local_1948 = local_1948 + -1;
    cfd::core::Pubkey::~Pubkey(local_1948);
  } while (local_1948 != &local_f80);
  std::__cxx11::string::~string(local_12a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a1);
  std::__cxx11::string::~string(local_1278);
  std::allocator<char>::~allocator((allocator<char> *)&local_1279);
  std::__cxx11::string::~string(local_1250);
  std::allocator<char>::~allocator((allocator<char> *)&local_1251);
  std::__cxx11::string::~string(local_1228);
  std::allocator<char>::~allocator((allocator<char> *)&local_1229);
  std::__cxx11::string::~string(local_1200);
  std::allocator<char>::~allocator((allocator<char> *)&local_1201);
  std::__cxx11::string::~string(local_11d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d9);
  std::__cxx11::string::~string(local_11b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11b1);
  std::__cxx11::string::~string(local_1188);
  std::allocator<char>::~allocator((allocator<char> *)&local_1189);
  std::__cxx11::string::~string(local_1160);
  std::allocator<char>::~allocator((allocator<char> *)&local_1161);
  std::__cxx11::string::~string(local_1138);
  std::allocator<char>::~allocator((allocator<char> *)&local_1139);
  std::__cxx11::string::~string(local_1110);
  std::allocator<char>::~allocator((allocator<char> *)&local_1111);
  std::__cxx11::string::~string(local_10e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
  std::__cxx11::string::~string(local_10c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
  std::__cxx11::string::~string(local_1098);
  std::allocator<char>::~allocator((allocator<char> *)&local_1099);
  std::__cxx11::string::~string(local_1070);
  std::allocator<char>::~allocator((allocator<char> *)&local_1071);
  std::__cxx11::string::~string(local_1048);
  std::allocator<char>::~allocator((allocator<char> *)&local_1049);
  std::__cxx11::string::~string(local_1020);
  std::allocator<char>::~allocator((allocator<char> *)&local_1021);
  std::__cxx11::string::~string(local_ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
  std::__cxx11::string::~string(local_fd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
  std::__cxx11::string::~string(local_fa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
  std::allocator<char>::~allocator((allocator<char> *)(local_da0 + 0x16));
  std::__cxx11::string::~string(local_d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  std::allocator<cfd::core::Pubkey>::~allocator(&local_d63);
  local_1960 = (Pubkey *)local_9a0;
  do {
    local_1960 = local_1960 + -1;
    cfd::core::Pubkey::~Pubkey(local_1960);
  } while (local_1960 != &local_b08);
  std::__cxx11::string::~string(local_d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_d39);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_d11);
  std::__cxx11::string::~string(local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  std::__cxx11::string::~string(local_c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_c71);
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_c21);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
  std::__cxx11::string::~string(local_ba8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator((allocator<char> *)&local_b59);
  std::__cxx11::string::~string(local_b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_b31);
  std::allocator<char>::~allocator((allocator<char> *)(local_9a0 + 0x16));
  std::__cxx11::string::~string(local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  std::allocator<cfd::core::Pubkey>::~allocator(&local_963);
  local_1978 = (Pubkey *)local_5a0;
  do {
    local_1978 = local_1978 + -1;
    cfd::core::Pubkey::~Pubkey(local_1978);
  } while (local_1978 != &local_708);
  std::__cxx11::string::~string(local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::allocator<char>::~allocator((allocator<char> *)(local_5a0 + 0x16));
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::allocator<cfd::core::Pubkey>::~allocator(&local_563);
  local_1990 = (Pubkey *)local_4a0;
  do {
    local_1990 = local_1990 + -1;
    cfd::core::Pubkey::~Pubkey(local_1990);
  } while (local_1990 != &local_4e8);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::allocator<char>::~allocator((allocator<char> *)(local_4a0 + 0x16));
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::allocator<cfd::core::Pubkey>::~allocator(&local_463);
  local_19a8 = (Pubkey *)local_3e0;
  do {
    local_19a8 = local_19a8 + -1;
    cfd::core::Pubkey::~Pubkey(local_19a8);
  } while (local_19a8 != &local_410);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::allocator<char>::~allocator((allocator<char> *)(local_3e0 + 0x16));
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::allocator<cfd::core::Pubkey>::~allocator(&local_3a6);
  local_19c0 = &local_350;
  do {
    local_19c0 = local_19c0 + -1;
    cfd::core::Pubkey::~Pubkey(local_19c0);
  } while (local_19c0 != &local_368);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  cfd::core::Script::Script((Script *)&__range1);
  __end1 = std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::begin
                     ((vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *)local_28);
  test_vector._120_8_ =
       std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::end
                 ((vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_MultisigTestVector_*,_std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>_>
                                     *)&test_vector.is_witness), bVar1) {
    pMVar2 = __gnu_cxx::
             __normal_iterator<const_MultisigTestVector_*,_std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>_>
             ::operator*(&__end1);
    MultisigTestVector::MultisigTestVector((MultisigTestVector *)local_13a0,pMVar2);
    cfd::core::ScriptUtil::CreateMultisigRedeemScript
              ((int)&gtest_ar + 8,(vector *)(ulong)(uint)local_13a0._0_4_,SUB81(&test_vector,0));
    cfd::core::Script::operator=((Script *)&__range1,(Script *)&gtest_ar.message_);
    cfd::core::Script::~Script((Script *)&gtest_ar.message_);
    cfd::core::Script::GetHex_abi_cxx11_();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_();
    rhs = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_13e8,"actual.GetHex().c_str()",
               "test_vector.expect_multisig_script.GetHex().c_str()",pcVar3,rhs);
    std::__cxx11::string::~string(local_1428);
    std::__cxx11::string::~string(local_1408);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13e8);
    if (!bVar1) {
      testing::Message::Message(&local_1430);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_13e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&except,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x127,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_1430);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
      testing::Message::~Message(&local_1430);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_13e8);
    MultisigTestVector::~MultisigTestVector((MultisigTestVector *)local_13a0);
    __gnu_cxx::
    __normal_iterator<const_MultisigTestVector_*,_std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>_>
    ::operator++(&__end1);
  }
  cfd::core::Script::~Script((Script *)&__range1);
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::~vector
            ((vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> *)local_28);
  return;
}

Assistant:

TEST(ScriptUtil, CreateMultisigRedeemScriptTest) {
  const std::vector<MultisigTestVector> test_vectors = {
    // 1-of-1 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      },
      Script("512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a051ae"),
      "",
      false
    },
    // 1-of-2 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      },
      Script("512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c52ae"),
      "",
      false
    },
    // 2-of-3 Multisig
    {
      2,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
      },
      Script("522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"),
      "",
      false
    },
    // 12-of-15 Multisig
    {
      12,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
      },
      Script("5c2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"),
      "",
      false
    },
    // 15-of-15 Multisig
    {
      15,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
      },
      Script("5f2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"),
      "",
      false
    },
    // 20-of-20 Multisig on witness
    {
      20,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
        Pubkey("0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e"),
        Pubkey("02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8"),
        Pubkey("03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950"),
        Pubkey("024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561"),
      },
      Script("01142102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db21030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55210267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e2102f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b82103968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb595021024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd25610114ae"),
      "",
      true
    },
  };

  Script actual;
  for (MultisigTestVector test_vector : test_vectors) {
    try {
      actual = ScriptUtil::CreateMultisigRedeemScript(
          test_vector.req_sig, test_vector.input_pubkeys,
          test_vector.is_witness);
      EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_multisig_script.GetHex().c_str());
    } catch (const CfdException& except) {
      EXPECT_STREQ(except.what(), "");
      EXPECT_EQ(test_vector.req_sig, 0);
    }
  }
}